

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_list.c
# Opt level: O1

REF_STATUS ref_list_deep_copy(REF_LIST *ref_list_ptr,REF_LIST original)

{
  int iVar1;
  REF_INT *pRVar2;
  REF_LIST pRVar3;
  REF_INT *pRVar4;
  undefined8 uVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  
  pRVar3 = (REF_LIST)malloc(0x10);
  *ref_list_ptr = pRVar3;
  if (pRVar3 == (REF_LIST)0x0) {
    pcVar8 = "malloc *ref_list_ptr of REF_LIST_STRUCT NULL";
    uVar5 = 0x36;
  }
  else {
    pRVar3->n = original->n;
    iVar1 = original->max;
    pRVar3->max = iVar1;
    if ((long)iVar1 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list.c",0x3c,
             "ref_list_deep_copy","malloc ref_list->value of REF_INT negative");
      return 1;
    }
    pRVar4 = (REF_INT *)malloc((long)iVar1 << 2);
    pRVar3->value = pRVar4;
    if (pRVar4 != (REF_INT *)0x0) {
      if (0 < pRVar3->n) {
        pRVar2 = original->value;
        uVar6 = 1;
        if (1 < pRVar3->n) {
          uVar6 = (ulong)(uint)pRVar3->n;
        }
        uVar7 = 0;
        do {
          pRVar4[uVar7] = pRVar2[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
        return 0;
      }
      return 0;
    }
    pcVar8 = "malloc ref_list->value of REF_INT NULL";
    uVar5 = 0x3c;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list.c",uVar5,
         "ref_list_deep_copy",pcVar8);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_list_deep_copy(REF_LIST *ref_list_ptr,
                                      REF_LIST original) {
  REF_LIST ref_list;
  REF_INT i;

  ref_malloc(*ref_list_ptr, 1, REF_LIST_STRUCT);
  ref_list = (*ref_list_ptr);

  ref_list_n(ref_list) = ref_list_n(original);
  ref_list_max(ref_list) = ref_list_max(original);

  ref_malloc(ref_list->value, ref_list_max(ref_list), REF_INT);
  for (i = 0; i < ref_list_n(ref_list); i++)
    ref_list->value[i] = original->value[i];

  return REF_SUCCESS;
}